

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::FormattingScene::ColorSpace(FormattingScene *this,string *n,FileLoc loc)

{
  string local_30;
  
  indent_abi_cxx11_(&local_30,this,0);
  Printf<std::__cxx11::string,std::__cxx11::string_const&>("%sColorSpace \"%s\"\n",&local_30,n);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void FormattingScene::ColorSpace(const std::string &n, FileLoc loc) {
    Printf("%sColorSpace \"%s\"\n", indent(), n);
}